

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O0

int hmacResult(HMACContext *ctx,uint8_t *digest)

{
  int iVar1;
  bool local_21;
  uint8_t *digest_local;
  HMACContext *ctx_local;
  
  if (ctx == (HMACContext *)0x0) {
    ctx_local._4_4_ = 1;
  }
  else {
    iVar1 = USHAResult(&ctx->shaContext,digest);
    local_21 = true;
    if (iVar1 == 0) {
      iVar1 = USHAReset(&ctx->shaContext,ctx->whichSha);
      local_21 = true;
      if (iVar1 == 0) {
        iVar1 = USHAInput(&ctx->shaContext,ctx->k_opad,ctx->blockSize);
        local_21 = true;
        if (iVar1 == 0) {
          iVar1 = USHAInput(&ctx->shaContext,digest,ctx->hashSize);
          local_21 = true;
          if (iVar1 == 0) {
            iVar1 = USHAResult(&ctx->shaContext,digest);
            local_21 = iVar1 != 0;
          }
        }
      }
    }
    ctx_local._4_4_ = (uint)local_21;
  }
  return ctx_local._4_4_;
}

Assistant:

int hmacResult(HMACContext *ctx, uint8_t digest[USHAMaxHashSize])
{
    if (!ctx) return shaNull;

    /* finish up 1st pass */
    /* (Use digest here as a temporary buffer.) */
    return USHAResult(&ctx->shaContext, digest) ||

        /* perform outer SHA */
        /* init context for 2nd pass */
        USHAReset(&ctx->shaContext, (SHAversion)ctx->whichSha) ||

        /* start with outer pad */
        USHAInput(&ctx->shaContext, ctx->k_opad, ctx->blockSize) ||

        /* then results of 1st hash */
        USHAInput(&ctx->shaContext, digest, ctx->hashSize) ||

        /* finish up 2nd pass */
        USHAResult(&ctx->shaContext, digest);
}